

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_wcwidth.c
# Opt level: O0

wchar_t bisearch(uint ucs,interval *table,wchar_t max)

{
  int iVar1;
  wchar_t local_20;
  wchar_t mid;
  wchar_t min;
  wchar_t max_local;
  interval *table_local;
  uint ucs_local;
  
  local_20 = L'\0';
  if ((table->first <= ucs) && (mid = max, ucs <= table[max].last)) {
    while (local_20 <= mid) {
      iVar1 = (local_20 + mid) / 2;
      if (table[iVar1].last < ucs) {
        local_20 = iVar1 + L'\x01';
      }
      else {
        if (table[iVar1].first <= ucs) {
          return L'\x01';
        }
        mid = iVar1 + L'\xffffffff';
      }
    }
  }
  return L'\0';
}

Assistant:

static int bisearch(unsigned int ucs, const struct interval *table, int max) {
  int min = 0;
  int mid;

  if (ucs < table[0].first || ucs > table[max].last)
    return 0;
  while (max >= min) {
    mid = (min + max) / 2;
    if (ucs > table[mid].last)
      min = mid + 1;
    else if (ucs < table[mid].first)
      max = mid - 1;
    else
      return 1;
  }

  return 0;
}